

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O1

JsonToken * json::JsonLexer::nextToken(JsonToken *__return_storage_ptr__,istream *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  istream *piVar2;
  runtime_error *this;
  long *plVar3;
  size_type *psVar4;
  size_t __nbytes;
  size_t __nbytes_00;
  size_t __nbytes_01;
  int __fd;
  char c;
  byte local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  piVar2 = std::operator>>(input,(char *)&local_89);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
    __return_storage_ptr__->type = EndOfFile;
    goto LAB_0010a285;
  }
  if (0x5a < local_89) {
    __fd = (int)input;
    if (local_89 < 0x6e) {
      if (local_89 == 0x5b) {
        __return_storage_ptr__->type = BeginArray;
      }
      else if (local_89 == 0x5d) {
        __return_storage_ptr__->type = EndArray;
      }
      else {
        if (local_89 != 0x66) goto switchD_0010a2c4_caseD_23;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"alse","");
        read(__fd,&local_88,__nbytes_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        __return_storage_ptr__->type = False;
      }
    }
    else if (local_89 < 0x7b) {
      if (local_89 == 0x6e) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"ull","");
        read(__fd,&local_88,__nbytes_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        __return_storage_ptr__->type = Null;
      }
      else {
        if (local_89 != 0x74) {
switchD_0010a2c4_caseD_23:
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_68,'\x01');
          std::operator+(&local_48,"Found illegal character: \'",&local_68);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
          local_88._M_dataplus._M_p = (pointer)*plVar3;
          psVar4 = (size_type *)(plVar3 + 2);
          if ((size_type *)local_88._M_dataplus._M_p == psVar4) {
            local_88.field_2._M_allocated_capacity = *psVar4;
            local_88.field_2._8_8_ = plVar3[3];
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          }
          else {
            local_88.field_2._M_allocated_capacity = *psVar4;
          }
          local_88._M_string_length = plVar3[1];
          *plVar3 = (long)psVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::runtime_error::runtime_error(this,(string *)&local_88);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"rue","");
        read(__fd,&local_88,__nbytes);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        __return_storage_ptr__->type = True;
      }
    }
    else if (local_89 == 0x7b) {
      __return_storage_ptr__->type = BeginObject;
    }
    else {
      if (local_89 != 0x7d) goto switchD_0010a2c4_caseD_23;
      __return_storage_ptr__->type = EndObject;
    }
    goto LAB_0010a285;
  }
  switch(local_89) {
  case 0x22:
    readString_abi_cxx11_
              (&local_88,(JsonLexer *)input,(istream *)&switchD_0010a2c4::switchdataD_0010c590);
    __return_storage_ptr__->type = String;
    break;
  default:
    goto switchD_0010a2c4_caseD_23;
  case 0x2c:
    __return_storage_ptr__->type = ValueSeparator;
    goto LAB_0010a285;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    readNumber_abi_cxx11_
              (&local_88,(JsonLexer *)input,(istream *)(ulong)(uint)(int)(char)local_89,local_89);
    __return_storage_ptr__->type = Number;
    break;
  case 0x3a:
    __return_storage_ptr__->type = NameSeparator;
LAB_0010a285:
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    (__return_storage_ptr__->value)._M_string_length = 0;
    (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  paVar1 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
    paVar1->_M_allocated_capacity = local_88.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = local_88.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->value)._M_dataplus._M_p = local_88._M_dataplus._M_p;
    (__return_storage_ptr__->value).field_2._M_allocated_capacity =
         local_88.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->value)._M_string_length = local_88._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

JsonToken JsonLexer::nextToken(std::istream &input)
    {
        char c;

        if (input >> c)
        {
            switch (c)
            {
            case '[':
                return {JsonTokenType::BeginArray};
            case '{':
                return {JsonTokenType::BeginObject};
            case ']':
                return {JsonTokenType::EndArray};
            case '}':
                return {JsonTokenType::EndObject};
            case ':':
                return {JsonTokenType::NameSeparator};
            case ',':
                return {JsonTokenType::ValueSeparator};
            case 'f':
                read(input, "alse"); // Make sure that the next characters in the stream are 'a', 'l', 's' and 'e'.
                return {JsonTokenType::False};
            case 't':
                read(input, "rue");
                return {JsonTokenType::True};
            case 'n':
                read(input, "ull");
                return {JsonTokenType::Null};
            case '-':
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                return {JsonTokenType::Number, readNumber(input, c)};
            case '\"':
                return {JsonTokenType::String, readString(input)};
            default:
                throw std::runtime_error("Found illegal character: '" + std::string(1, c) + "'");
            }
        }

        return {JsonTokenType::EndOfFile};
    }